

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall
icu_63::OlsonTimeZone::OlsonTimeZone
          (OlsonTimeZone *this,UResourceBundle *top,UResourceBundle *res,UnicodeString *tzid,
          UErrorCode *ec)

{
  int32_t iVar1;
  UBool UVar2;
  int16_t iVar3;
  int32_t *piVar4;
  uint8_t *puVar5;
  UChar *pUVar6;
  UResourceBundle *resB;
  SimpleTimeZone *this_00;
  double dVar7;
  SimpleTimeZone *local_280;
  undefined1 local_1d8 [8];
  UnicodeString emptyStr;
  int32_t *ruleData;
  UResourceBundle *rule;
  undefined1 local_180 [8];
  UnicodeString ruleID;
  int32_t ruleYear;
  int32_t ruleRaw;
  UChar *ruleIdUStr;
  UResourceBundle r;
  int32_t len;
  UErrorCode *ec_local;
  UnicodeString *tzid_local;
  UResourceBundle *res_local;
  UResourceBundle *top_local;
  OlsonTimeZone *this_local;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,tzid);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__OlsonTimeZone_004dcf70;
  this->finalZone = (SimpleTimeZone *)0x0;
  clearTransitionRules(this);
  if (((top == (UResourceBundle *)0x0) || (res == (UResourceBundle *)0x0)) &&
     (UVar2 = ::U_SUCCESS(*ec), UVar2 != '\0')) {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
  }
  UVar2 = ::U_SUCCESS(*ec);
  if (UVar2 != '\0') {
    ures_initStackObject_63((UResourceBundle *)&ruleIdUStr);
    ures_getByKey_63(res,"transPre32",(UResourceBundle *)&ruleIdUStr,ec);
    piVar4 = ures_getIntVector_63((UResourceBundle *)&ruleIdUStr,&r.fSize,ec);
    this->transitionTimesPre32 = piVar4;
    this->transitionCountPre32 = (int16_t)(r.fSize >> 1);
    if (*ec == U_MISSING_RESOURCE_ERROR) {
      this->transitionTimesPre32 = (int32_t *)0x0;
      this->transitionCountPre32 = 0;
      *ec = U_ZERO_ERROR;
    }
    else {
      UVar2 = ::U_SUCCESS(*ec);
      if ((UVar2 != '\0') && (((r.fSize < 0 || (0x7fff < r.fSize)) || ((r.fSize & 1U) != 0)))) {
        *ec = U_INVALID_FORMAT_ERROR;
      }
    }
    ures_getByKey_63(res,"trans",(UResourceBundle *)&ruleIdUStr,ec);
    piVar4 = ures_getIntVector_63((UResourceBundle *)&ruleIdUStr,&r.fSize,ec);
    this->transitionTimes32 = piVar4;
    this->transitionCount32 = (int16_t)r.fSize;
    if (*ec == U_MISSING_RESOURCE_ERROR) {
      this->transitionTimes32 = (int32_t *)0x0;
      this->transitionCount32 = 0;
      *ec = U_ZERO_ERROR;
    }
    else {
      UVar2 = ::U_SUCCESS(*ec);
      if ((UVar2 != '\0') && ((r.fSize < 0 || (0x7fff < r.fSize)))) {
        *ec = U_INVALID_FORMAT_ERROR;
      }
    }
    ures_getByKey_63(res,"transPost32",(UResourceBundle *)&ruleIdUStr,ec);
    piVar4 = ures_getIntVector_63((UResourceBundle *)&ruleIdUStr,&r.fSize,ec);
    this->transitionTimesPost32 = piVar4;
    this->transitionCountPost32 = (int16_t)(r.fSize >> 1);
    if (*ec == U_MISSING_RESOURCE_ERROR) {
      this->transitionTimesPost32 = (int32_t *)0x0;
      this->transitionCountPost32 = 0;
      *ec = U_ZERO_ERROR;
    }
    else {
      UVar2 = ::U_SUCCESS(*ec);
      if ((UVar2 != '\0') && (((r.fSize < 0 || (0x7fff < r.fSize)) || ((r.fSize & 1U) != 0)))) {
        *ec = U_INVALID_FORMAT_ERROR;
      }
    }
    ures_getByKey_63(res,"typeOffsets",(UResourceBundle *)&ruleIdUStr,ec);
    piVar4 = ures_getIntVector_63((UResourceBundle *)&ruleIdUStr,&r.fSize,ec);
    this->typeOffsets = piVar4;
    UVar2 = ::U_SUCCESS(*ec);
    if ((UVar2 != '\0') && (((r.fSize < 2 || (0x7ffe < r.fSize)) || ((r.fSize & 1U) != 0)))) {
      *ec = U_INVALID_FORMAT_ERROR;
    }
    this->typeCount = (int16_t)((uint)(int)(short)r.fSize >> 1);
    this->typeMapData = (uint8_t *)0x0;
    iVar3 = transitionCount(this);
    if (0 < iVar3) {
      ures_getByKey_63(res,"typeMap",(UResourceBundle *)&ruleIdUStr,ec);
      puVar5 = ures_getBinary_63((UResourceBundle *)&ruleIdUStr,&r.fSize,ec);
      this->typeMapData = puVar5;
      if (*ec == U_MISSING_RESOURCE_ERROR) {
        *ec = U_INVALID_FORMAT_ERROR;
      }
      else {
        UVar2 = ::U_SUCCESS(*ec);
        iVar1 = r.fSize;
        if ((UVar2 != '\0') && (iVar3 = transitionCount(this), iVar1 != iVar3)) {
          *ec = U_INVALID_FORMAT_ERROR;
        }
      }
    }
    pUVar6 = ures_getStringByKey_63(res,"finalRule",&r.fSize,ec);
    ures_getByKey_63(res,"finalRaw",(UResourceBundle *)&ruleIdUStr,ec);
    ruleID.fUnion._52_4_ = ures_getInt_63((UResourceBundle *)&ruleIdUStr,ec);
    ures_getByKey_63(res,"finalYear",(UResourceBundle *)&ruleIdUStr,ec);
    ruleID.fUnion._48_4_ = ures_getInt_63((UResourceBundle *)&ruleIdUStr,ec);
    UVar2 = ::U_SUCCESS(*ec);
    if (UVar2 == '\0') {
      if (*ec == U_MISSING_RESOURCE_ERROR) {
        *ec = U_ZERO_ERROR;
      }
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&rule,pUVar6);
      UnicodeString::UnicodeString
                ((UnicodeString *)local_180,'\x01',(ConstChar16Ptr *)&rule,r.fSize);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&rule);
      resB = TimeZone::loadRule(top,(UnicodeString *)local_180,(UResourceBundle *)0x0,ec);
      piVar4 = &r.fSize;
      emptyStr.fUnion._48_8_ = ures_getIntVector_63(resB,piVar4,ec);
      UVar2 = ::U_SUCCESS(*ec);
      if ((UVar2 == '\0') || (r.fSize != 0xb)) {
        *ec = U_INVALID_FORMAT_ERROR;
      }
      else {
        UnicodeString::UnicodeString((UnicodeString *)local_1d8);
        this_00 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)piVar4);
        local_280 = (SimpleTimeZone *)0x0;
        if (this_00 != (SimpleTimeZone *)0x0) {
          SimpleTimeZone::SimpleTimeZone
                    (this_00,ruleID.fUnion._52_4_ * 1000,(UnicodeString *)local_1d8,
                     *(int8_t *)emptyStr.fUnion._48_8_,*(int8_t *)(emptyStr.fUnion._48_8_ + 4),
                     *(int8_t *)(emptyStr.fUnion._48_8_ + 8),
                     *(int *)(emptyStr.fUnion._48_8_ + 0xc) * 1000,
                     *(TimeMode *)(emptyStr.fUnion._48_8_ + 0x10),
                     *(int8_t *)(emptyStr.fUnion._48_8_ + 0x14),
                     *(int8_t *)(emptyStr.fUnion._48_8_ + 0x18),
                     *(int8_t *)(emptyStr.fUnion._48_8_ + 0x1c),
                     *(int *)(emptyStr.fUnion._48_8_ + 0x20) * 1000,
                     *(TimeMode *)(emptyStr.fUnion._48_8_ + 0x24),
                     *(int *)(emptyStr.fUnion._48_8_ + 0x28) * 1000,ec);
          local_280 = this_00;
        }
        this->finalZone = local_280;
        if (this->finalZone == (SimpleTimeZone *)0x0) {
          *ec = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          this->finalStartYear = ruleID.fUnion._48_4_;
          dVar7 = Grego::fieldsToDay(this->finalStartYear,0,1);
          this->finalStartMillis = dVar7 * 86400000.0;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_1d8);
      }
      ures_close_63(resB);
      UnicodeString::~UnicodeString((UnicodeString *)local_180);
    }
    ures_close_63((UResourceBundle *)&ruleIdUStr);
    pUVar6 = ZoneMeta::getCanonicalCLDRID(tzid,ec);
    this->canonicalID = pUVar6;
  }
  UVar2 = ::U_FAILURE(*ec);
  if (UVar2 != '\0') {
    constructEmpty(this);
  }
  return;
}

Assistant:

OlsonTimeZone::OlsonTimeZone(const UResourceBundle* top,
                             const UResourceBundle* res,
                             const UnicodeString& tzid,
                             UErrorCode& ec) :
  BasicTimeZone(tzid), finalZone(NULL)
{
    clearTransitionRules();
    U_DEBUG_TZ_MSG(("OlsonTimeZone(%s)\n", ures_getKey((UResourceBundle*)res)));
    if ((top == NULL || res == NULL) && U_SUCCESS(ec)) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (U_SUCCESS(ec)) {
        // TODO -- clean up -- Doesn't work if res points to an alias
        //        // TODO remove nonconst casts below when ures_* API is fixed
        //        setID(ures_getKey((UResourceBundle*) res)); // cast away const

        int32_t len;
        UResourceBundle r;
        ures_initStackObject(&r);

        // Pre-32bit second transitions
        ures_getByKey(res, kTRANSPRE32, &r, &ec);
        transitionTimesPre32 = ures_getIntVector(&r, &len, &ec);
        transitionCountPre32 = static_cast<int16_t>(len >> 1);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No pre-32bit transitions
            transitionTimesPre32 = NULL;
            transitionCountPre32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF || (len & 1) != 0) /* len must be even */) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // 32bit second transitions
        ures_getByKey(res, kTRANS, &r, &ec);
        transitionTimes32 = ures_getIntVector(&r, &len, &ec);
        transitionCount32 = static_cast<int16_t>(len);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No 32bit transitions
            transitionTimes32 = NULL;
            transitionCount32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF)) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // Post-32bit second transitions
        ures_getByKey(res, kTRANSPOST32, &r, &ec);
        transitionTimesPost32 = ures_getIntVector(&r, &len, &ec);
        transitionCountPost32 = static_cast<int16_t>(len >> 1);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No pre-32bit transitions
            transitionTimesPost32 = NULL;
            transitionCountPost32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF || (len & 1) != 0) /* len must be even */) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // Type offsets list must be of even size, with size >= 2
        ures_getByKey(res, kTYPEOFFSETS, &r, &ec);
        typeOffsets = ures_getIntVector(&r, &len, &ec);
        if (U_SUCCESS(ec) && (len < 2 || len > 0x7FFE || (len & 1) != 0)) {
            ec = U_INVALID_FORMAT_ERROR;
        }
        typeCount = (int16_t) len >> 1;

        // Type map data must be of the same size as the transition count
        typeMapData =  NULL;
        if (transitionCount() > 0) {
            ures_getByKey(res, kTYPEMAP, &r, &ec);
            typeMapData = ures_getBinary(&r, &len, &ec);
            if (ec == U_MISSING_RESOURCE_ERROR) {
                // no type mapping data
                ec = U_INVALID_FORMAT_ERROR;
            } else if (U_SUCCESS(ec) && len != transitionCount()) {
                ec = U_INVALID_FORMAT_ERROR;
            }
        }

        // Process final rule and data, if any
        const UChar *ruleIdUStr = ures_getStringByKey(res, kFINALRULE, &len, &ec);
        ures_getByKey(res, kFINALRAW, &r, &ec);
        int32_t ruleRaw = ures_getInt(&r, &ec);
        ures_getByKey(res, kFINALYEAR, &r, &ec);
        int32_t ruleYear = ures_getInt(&r, &ec);
        if (U_SUCCESS(ec)) {
            UnicodeString ruleID(TRUE, ruleIdUStr, len);
            UResourceBundle *rule = TimeZone::loadRule(top, ruleID, NULL, ec);
            const int32_t *ruleData = ures_getIntVector(rule, &len, &ec); 
            if (U_SUCCESS(ec) && len == 11) {
                UnicodeString emptyStr;
                finalZone = new SimpleTimeZone(
                    ruleRaw * U_MILLIS_PER_SECOND,
                    emptyStr,
                    (int8_t)ruleData[0], (int8_t)ruleData[1], (int8_t)ruleData[2],
                    ruleData[3] * U_MILLIS_PER_SECOND,
                    (SimpleTimeZone::TimeMode) ruleData[4],
                    (int8_t)ruleData[5], (int8_t)ruleData[6], (int8_t)ruleData[7],
                    ruleData[8] * U_MILLIS_PER_SECOND,
                    (SimpleTimeZone::TimeMode) ruleData[9],
                    ruleData[10] * U_MILLIS_PER_SECOND, ec);
                if (finalZone == NULL) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                } else {
                    finalStartYear = ruleYear;

                    // Note: Setting finalStartYear to the finalZone is problematic.  When a date is around
                    // year boundary, SimpleTimeZone may return false result when DST is observed at the 
                    // beginning of year.  We could apply safe margin (day or two), but when one of recurrent
                    // rules falls around year boundary, it could return false result.  Without setting the
                    // start year, finalZone works fine around the year boundary of the start year.

                    // finalZone->setStartYear(finalStartYear);


                    // Compute the millis for Jan 1, 0:00 GMT of the finalYear

                    // Note: finalStartMillis is used for detecting either if
                    // historic transition data or finalZone to be used.  In an
                    // extreme edge case - for example, two transitions fall into
                    // small windows of time around the year boundary, this may
                    // result incorrect offset computation.  But I think it will
                    // never happen practically.  Yoshito - Feb 20, 2010
                    finalStartMillis = Grego::fieldsToDay(finalStartYear, 0, 1) * U_MILLIS_PER_DAY;
                }
            } else {
                ec = U_INVALID_FORMAT_ERROR;
            }
            ures_close(rule);
        } else if (ec == U_MISSING_RESOURCE_ERROR) {
            // No final zone
            ec = U_ZERO_ERROR;
        }
        ures_close(&r);

        // initialize canonical ID
        canonicalID = ZoneMeta::getCanonicalCLDRID(tzid, ec);
    }

    if (U_FAILURE(ec)) {
        constructEmpty();
    }
}